

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadPackedFixed<double>
          (EpsCopyInputStream *this,char *ptr,int size,RepeatedField<double> *out)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  double *dst;
  int block_size;
  int old_entries;
  int num;
  double *dst_1;
  int block_size_1;
  int old_entries_1;
  int num_1;
  int nbytes;
  RepeatedField<double> *out_local;
  char *pcStack_20;
  int size_local;
  char *ptr_local;
  EpsCopyInputStream *this_local;
  
  if (ptr == (char *)0x0) {
    this_local = (EpsCopyInputStream *)0x0;
  }
  else {
    old_entries_1 = ((int)this->buffer_end_ + 0x10) - (int)ptr;
    out_local._4_4_ = size;
    pcStack_20 = ptr;
    while (old_entries_1 < out_local._4_4_) {
      iVar1 = (int)((ulong)(long)old_entries_1 >> 3);
      iVar2 = RepeatedField<double>::size(out);
      RepeatedField<double>::Reserve(out,iVar2 + iVar1);
      pdVar3 = RepeatedField<double>::AddNAlreadyReserved(out,iVar1);
      memcpy(pdVar3,pcStack_20,(long)(iVar1 * 8));
      out_local._4_4_ = out_local._4_4_ + iVar1 * -8;
      if (this->limit_ < 0x11) {
        return (char *)0x0;
      }
      pcStack_20 = Next(this);
      if (pcStack_20 == (char *)0x0) {
        return (char *)0x0;
      }
      pcStack_20 = pcStack_20 + (0x10 - (old_entries_1 + iVar1 * -8));
      old_entries_1 = ((int)this->buffer_end_ + 0x10) - (int)pcStack_20;
    }
    iVar1 = (int)((ulong)(long)out_local._4_4_ >> 3);
    iVar2 = RepeatedField<double>::size(out);
    RepeatedField<double>::Reserve(out,iVar2 + iVar1);
    iVar2 = iVar1 << 3;
    pdVar3 = RepeatedField<double>::AddNAlreadyReserved(out,iVar1);
    memcpy(pdVar3,pcStack_20,(long)iVar2);
    this_local = (EpsCopyInputStream *)(pcStack_20 + iVar2);
    if (out_local._4_4_ != iVar2) {
      this_local = (EpsCopyInputStream *)0x0;
    }
  }
  return (char *)this_local;
}

Assistant:

const char* EpsCopyInputStream::ReadPackedFixed(const char* ptr, int size,
                                                RepeatedField<T>* out) {
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  int nbytes = buffer_end_ + kSlopBytes - ptr;
  while (size > nbytes) {
    int num = nbytes / sizeof(T);
    int old_entries = out->size();
    out->Reserve(old_entries + num);
    int block_size = num * sizeof(T);
    auto dst = out->AddNAlreadyReserved(num);
#ifdef PROTOBUF_LITTLE_ENDIAN
    std::memcpy(dst, ptr, block_size);
#else
    for (int i = 0; i < num; i++)
      dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
    size -= block_size;
    if (limit_ <= kSlopBytes) return nullptr;
    ptr = Next();
    if (ptr == nullptr) return nullptr;
    ptr += kSlopBytes - (nbytes - block_size);
    nbytes = buffer_end_ + kSlopBytes - ptr;
  }
  int num = size / sizeof(T);
  int old_entries = out->size();
  out->Reserve(old_entries + num);
  int block_size = num * sizeof(T);
  auto dst = out->AddNAlreadyReserved(num);
#ifdef PROTOBUF_LITTLE_ENDIAN
  std::memcpy(dst, ptr, block_size);
#else
  for (int i = 0; i < num; i++) dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
  ptr += block_size;
  if (size != block_size) return nullptr;
  return ptr;
}